

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

int __thiscall OpenSSLWrapper::SslConnection::SSLDoHandshake(SslConnection *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxSsl);
  if (iVar1 == 0) {
    iVar1 = SSL_do_handshake((SSL *)this->m_ssl);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int SslConnection::SSLDoHandshake()
    {
        lock_guard<mutex> lk(m_mxSsl);
        return SSL_do_handshake(m_ssl);
    }